

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void par_shapes__torus(float *uv,float *xyz,void *userdata)

{
  float fVar1;
  float __x;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = *userdata;
  fVar4 = (*uv + *uv) * 3.1415927;
  __x = (uv[1] + uv[1]) * 3.1415927;
  fVar2 = cosf(__x);
  fVar2 = fVar2 * fVar1 + 1.0;
  fVar3 = cosf(fVar4);
  *xyz = fVar3 * fVar2;
  fVar4 = sinf(fVar4);
  xyz[1] = fVar4 * fVar2;
  fVar4 = sinf(__x);
  xyz[2] = fVar4 * fVar1;
  return;
}

Assistant:

static void par_shapes__torus(float const* uv, float* xyz, void* userdata)
{
    float major = 1;
    float minor = *((float*) userdata);
    float theta = uv[0] * 2 * PAR_PI;
    float phi = uv[1] * 2 * PAR_PI;
    float beta = major + minor * cosf(phi);
    xyz[0] = cosf(theta) * beta;
    xyz[1] = sinf(theta) * beta;
    xyz[2] = sinf(phi) * minor;
}